

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::GenerateLdThisCheck(Lowerer *this,Instr *instr)

{
  bool bVar1;
  Opnd *pOVar2;
  RegOpnd *regOpnd;
  LabelInstr *labelHelper;
  LabelInstr *target;
  LabelInstr *fallthrough;
  LabelInstr *helper;
  RegOpnd *src1;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar2 = IR::Instr::GetSrc1(instr);
  regOpnd = IR::Opnd::AsRegOpnd(pOVar2);
  labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  GenerateIsRecyclableObject(this,regOpnd,instr,labelHelper,true);
  pOVar2 = IR::Instr::GetDst(instr);
  if (pOVar2 != (Opnd *)0x0) {
    pOVar2 = IR::Instr::GetDst(instr);
    bVar1 = IR::Opnd::IsEqual(pOVar2,&regOpnd->super_Opnd);
    if (!bVar1) {
      pOVar2 = IR::Instr::GetDst(instr);
      InsertMove(pOVar2,&regOpnd->super_Opnd,instr,true);
    }
  }
  InsertBranch(Br,target,instr);
  IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  return true;
}

Assistant:

bool
Lowerer::GenerateLdThisCheck(IR::Instr * instr)
{
    //
    // If not a recyclable object, jump to $helper
    // MOV dst, src1                                      -- return the object itself
    // JMP $fallthrough
    // $helper:
    //      (caller generates helper call)
    // $fallthrough:
    //
    IR::RegOpnd * src1 = instr->GetSrc1()->AsRegOpnd();
    IR::LabelInstr * helper = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr * fallthrough = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    GenerateIsRecyclableObject(src1, instr, helper);

    // MOV dst, src1
    if (instr->GetDst() && !instr->GetDst()->IsEqual(src1))
    {
        InsertMove(instr->GetDst(), src1, instr);
    }

    // JMP $fallthrough
    InsertBranch(Js::OpCode::Br, fallthrough, instr);

    // $helper:
    //      (caller generates helper call)
    // $fallthrough:
    instr->InsertBefore(helper);
    instr->InsertAfter(fallthrough);

    return true;
}